

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  xmlXPathCompExprPtr pxVar1;
  int iVar2;
  int iVar3;
  xmlXPathObjectPtr value;
  xmlNodeSetPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr arg2;
  xmlXPathObjectPtr arg1;
  xmlXPathCompExprPtr comp;
  int cur;
  int total;
  xmlNodePtr *first_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  comp._4_4_ = 0;
  if (ctxt->error == 0) {
    if ((ctxt->context->opLimit == 0) || (iVar2 = xmlXPathCheckOpLimit(ctxt,1), -1 < iVar2)) {
      if (ctxt->context->depth < 5000) {
        ctxt->context->depth = ctxt->context->depth + 1;
        pxVar1 = ctxt->comp;
        switch(op->op) {
        case XPATH_OP_END:
          break;
        default:
          comp._4_4_ = xmlXPathCompOpEval(ctxt,op);
          break;
        case XPATH_OP_UNION:
          comp._4_4_ = xmlXPathCompOpEvalFirst(ctxt,pxVar1->steps + op->ch1,first);
          if (ctxt->error != 0) {
            return 0;
          }
          if (((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NODESET)) &&
             ((ctxt->value->nodesetval != (xmlNodeSetPtr)0x0 &&
              (0 < ctxt->value->nodesetval->nodeNr)))) {
            if (1 < ctxt->value->nodesetval->nodeNr) {
              xmlXPathNodeSetSort(ctxt->value->nodesetval);
            }
            *first = *ctxt->value->nodesetval->nodeTab;
          }
          iVar2 = xmlXPathCompOpEvalFirst(ctxt,pxVar1->steps + op->ch2,first);
          if (ctxt->error != 0) {
            return 0;
          }
          pxVar5 = valuePop(ctxt);
          value = valuePop(ctxt);
          if (((value == (xmlXPathObjectPtr)0x0) || (value->type != XPATH_NODESET)) ||
             ((pxVar5 == (xmlXPathObjectPtr)0x0 || (pxVar5->type != XPATH_NODESET)))) {
            xmlXPathReleaseObject(ctxt->context,value);
            xmlXPathReleaseObject(ctxt->context,pxVar5);
            xmlXPathErr(ctxt,0xb);
            return 0;
          }
          if ((ctxt->context->opLimit == 0) ||
             (((value->nodesetval == (xmlNodeSetPtr)0x0 ||
               (iVar3 = xmlXPathCheckOpLimit(ctxt,(long)value->nodesetval->nodeNr), -1 < iVar3)) &&
              ((pxVar5->nodesetval == (xmlNodeSetPtr)0x0 ||
               (iVar3 = xmlXPathCheckOpLimit(ctxt,(long)pxVar5->nodesetval->nodeNr), -1 < iVar3)))))
             ) {
            pxVar4 = xmlXPathNodeSetMerge(value->nodesetval,pxVar5->nodesetval);
            value->nodesetval = pxVar4;
            valuePush(ctxt,value);
            xmlXPathReleaseObject(ctxt->context,pxVar5);
            if (iVar2 < comp._4_4_) {
              xmlXPathCompSwap(op);
            }
            comp._4_4_ = iVar2 + comp._4_4_;
          }
          else {
            xmlXPathReleaseObject(ctxt->context,value);
            xmlXPathReleaseObject(ctxt->context,pxVar5);
          }
          break;
        case XPATH_OP_ROOT:
          xmlXPathRoot(ctxt);
          break;
        case XPATH_OP_NODE:
          if (op->ch1 != -1) {
            comp._4_4_ = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
          }
          if (ctxt->error != 0) {
            return 0;
          }
          if (op->ch2 != -1) {
            iVar2 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
            comp._4_4_ = iVar2 + comp._4_4_;
          }
          if (ctxt->error != 0) {
            return 0;
          }
          pxVar5 = xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
          valuePush(ctxt,pxVar5);
          break;
        case XPATH_OP_COLLECT:
          if (op->ch1 != -1) {
            iVar2 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
            if (ctxt->error != 0) {
              return 0;
            }
            iVar3 = xmlXPathNodeCollectAndTest(ctxt,op,first,(xmlNodePtr *)0x0,0);
            comp._4_4_ = iVar3 + iVar2;
          }
          break;
        case XPATH_OP_VALUE:
          pxVar5 = xmlXPathCacheObjectCopy(ctxt->context,(xmlXPathObjectPtr)op->value4);
          valuePush(ctxt,pxVar5);
          break;
        case XPATH_OP_FILTER:
          comp._4_4_ = xmlXPathCompOpEvalFilterFirst(ctxt,op,first);
          break;
        case XPATH_OP_SORT:
          if (op->ch1 != -1) {
            comp._4_4_ = xmlXPathCompOpEvalFirst(ctxt,pxVar1->steps + op->ch1,first);
          }
          if (ctxt->error != 0) {
            return 0;
          }
          if ((((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NODESET)) &&
              (ctxt->value->nodesetval != (xmlNodeSetPtr)0x0)) &&
             (1 < ctxt->value->nodesetval->nodeNr)) {
            xmlXPathNodeSetSort(ctxt->value->nodesetval);
          }
        }
        ctxt->context->depth = ctxt->context->depth + -1;
        ctxt_local._4_4_ = comp._4_4_;
      }
      else {
        xmlXPathErr(ctxt,0x1a);
        ctxt_local._4_4_ = 0;
      }
    }
    else {
      ctxt_local._4_4_ = 0;
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,
                        xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0, cur;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_UNION:
            total =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                        first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) {
                /*
                 * limit tree traversing to first node in the result
                 */
		/*
		* OPTIMIZE TODO: This implicitly sorts
		*  the result, even if not needed. E.g. if the argument
		*  of the count() function, no sorting is needed.
		* OPTIMIZE TODO: How do we know if the node-list wasn't
		*  already sorted?
		*/
		if (ctxt->value->nodesetval->nodeNr > 1)
		    xmlXPathNodeSetSort(ctxt->value->nodesetval);
                *first = ctxt->value->nodesetval->nodeTab[0];
            }
            cur =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch2],
                                        first);
	    CHECK_ERROR0;

            arg2 = valuePop(ctxt);
            arg1 = valuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

            /* TODO: Check memory error. */
            arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
                                                    arg2->nodesetval);
            valuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            /* optimizer */
	    if (total > cur)
		xmlXPathCompSwap(op);
            total += cur;
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
		ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total = xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, first, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            valuePush(ctxt,
                      xmlXPathCacheObjectCopy(ctxt->context,
			(xmlXPathObjectPtr) op->value4));
            break;
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total +=
                    xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                            first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
		&& (ctxt->value->nodesetval->nodeNr > 1))
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
            break;
#ifdef XP_OPTIMIZED_FILTER_FIRST
	case XPATH_OP_FILTER:
                total += xmlXPathCompOpEvalFilterFirst(ctxt, op, first);
            break;
#endif
        default:
            total += xmlXPathCompOpEval(ctxt, op);
            break;
    }

    ctxt->context->depth -= 1;
    return(total);
}